

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

char_type * __thiscall
booster::locale::gnu_gettext::mo_message<char>::get
          (mo_message<char> *this,int domain_id,char_type *context,char_type *single_id,int n)

{
  element_type *peVar1;
  uint uVar2;
  ulong in_RAX;
  const_reference pvVar3;
  char *pcVar4;
  char *pcVar5;
  int i;
  int iVar6;
  bool bVar7;
  pair_type pVar8;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pVar8 = get_string(this,domain_id,context,single_id);
  pcVar5 = pVar8.second;
  pcVar4 = pVar8.first;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pvVar3 = std::
             vector<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>_>_>
             ::at(&this->plural_forms_,(long)domain_id);
    if ((pvVar3->
        super___shared_ptr<booster::locale::gnu_gettext::lambda::plural,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr == (element_type *)0x0) {
      uVar2 = (uint)(n != 1);
    }
    else {
      peVar1 = (this->plural_forms_).
               super__Vector_base<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>_>_>
               ._M_impl.super__Vector_impl_data._M_start[domain_id].
               super___shared_ptr<booster::locale::gnu_gettext::lambda::plural,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      uVar2 = (**peVar1->_vptr_plural)(peVar1,(ulong)(uint)n);
    }
    for (iVar6 = 0; bVar7 = pcVar4 < pcVar5, iVar6 < (int)uVar2 && bVar7; iVar6 = iVar6 + 1) {
      uStack_38 = uStack_38 & 0xffffffff;
      pcVar4 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                         (pcVar4,pcVar5,(long)&uStack_38 + 4);
      if (pcVar4 == pcVar5) break;
      pcVar4 = pcVar4 + 1;
    }
    if (pcVar5 <= pcVar4) {
      pcVar4 = (char *)0x0;
    }
    if (iVar6 < (int)uVar2 && bVar7) {
      pcVar4 = (char *)0x0;
    }
  }
  return pcVar4;
}

Assistant:

virtual char_type const *get(int domain_id,char_type const *context,char_type const *single_id,int n) const
                {
                    pair_type ptr = get_string(domain_id,context,single_id);
                    if(!ptr.first)
                        return 0;
                    int form=0;
                    if(plural_forms_.at(domain_id)) 
                        form = (*plural_forms_[domain_id])(n);
                    else
                        form = n == 1 ? 0 : 1; // Fallback to english plural form

                    CharType const *p=ptr.first;
                    for(int i=0;p < ptr.second && i<form;i++) {
                        p=std::find(p,ptr.second,0);
                        if(p==ptr.second)
                            return 0;
                        ++p;
                    }
                    if(p>=ptr.second)
                        return 0;
                    return p;
                }